

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall
Rml::Element::InsertBefore(Element *this,ElementPtr *child,Element *adjacent_element)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  reference this_00;
  pointer pEVar7;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_70;
  int local_64;
  Element *pEStack_60;
  int i;
  Element *ancestor;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_48;
  const_iterator local_40;
  pointer local_38;
  Element *child_ptr;
  ulong uStack_28;
  bool found_child;
  size_t child_index;
  Element *adjacent_element_local;
  ElementPtr *child_local;
  Element *this_local;
  
  child_index = (size_t)adjacent_element;
  adjacent_element_local = (Element *)child;
  child_local = (ElementPtr *)this;
  bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)child);
  if ((!bVar3) &&
     (bVar3 = Assert("RMLUI_ASSERT(child)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x551), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  uStack_28 = 0;
  child_ptr._7_1_ = 0;
  if (child_index != 0) {
    for (uStack_28 = 0; uVar2 = uStack_28,
        sVar6 = ::std::
                vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ::size(&this->children), uVar2 < sVar6; uStack_28 = uStack_28 + 1) {
      this_00 = ::std::
                vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ::operator[](&this->children,uStack_28);
      pEVar7 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
      if (pEVar7 == (pointer)child_index) {
        child_ptr._7_1_ = 1;
        break;
      }
    }
  }
  local_38 = (pointer)0x0;
  if ((child_ptr._7_1_ & 1) == 0) {
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_70,child);
    local_38 = AppendChild(this,&local_70,true);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_70);
  }
  else {
    local_38 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(child);
    iVar4 = (int)uStack_28;
    iVar5 = GetNumChildren(this,false);
    if (iVar4 < iVar5) {
      (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
    }
    else {
      this->num_non_dom_children = this->num_non_dom_children + 1;
    }
    local_50._M_current =
         (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
         ::std::
         vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
         ::begin(&this->children);
    local_48 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
               ::operator+(&local_50,uStack_28);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
    ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
              ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
                *)&local_40,&local_48);
    ancestor = (Element *)
               ::std::
               vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ::insert(&this->children,local_40,child);
    SetParent(local_38,this);
    local_64 = 0;
    for (pEStack_60 = local_38; local_64 < 3 && pEStack_60 != (Element *)0x0;
        pEStack_60 = GetParentNode(pEStack_60)) {
      (*(pEStack_60->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])();
      local_64 = local_64 + 1;
    }
    DirtyStackingContext(this);
    DirtyDefinition(this,Self);
  }
  return local_38;
}

Assistant:

Element* Element::InsertBefore(ElementPtr child, Element* adjacent_element)
{
	RMLUI_ASSERT(child);
	// Find the position in the list of children of the adjacent element. If
	// it's nullptr or we can't find it, then we insert it at the end of the dom
	// children, as a dom element.
	size_t child_index = 0;
	bool found_child = false;
	if (adjacent_element)
	{
		for (child_index = 0; child_index < children.size(); child_index++)
		{
			if (children[child_index].get() == adjacent_element)
			{
				found_child = true;
				break;
			}
		}
	}

	Element* child_ptr = nullptr;

	if (found_child)
	{
		child_ptr = child.get();

		if ((int)child_index >= GetNumChildren())
			num_non_dom_children++;
		else
			DirtyLayout();

		children.insert(children.begin() + child_index, std::move(child));
		child_ptr->SetParent(this);

		Element* ancestor = child_ptr;
		for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
			ancestor->OnChildAdd(child_ptr);

		DirtyStackingContext();
		DirtyDefinition(DirtyNodes::Self);
	}
	else
	{
		child_ptr = AppendChild(std::move(child));
	}

	return child_ptr;
}